

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedSeparateCase::deinit
          (ComputeShaderGeneratedSeparateCase *this)

{
  ShaderProgram *pSVar1;
  ComputeShaderGeneratedSeparateCase *this_local;
  
  ComputeShaderGeneratedCase::deinit(&this->super_ComputeShaderGeneratedCase);
  if (this->m_computeCmdProgram != (ShaderProgram *)0x0) {
    pSVar1 = this->m_computeCmdProgram;
    if (pSVar1 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar1);
      operator_delete(pSVar1,0xd0);
    }
    this->m_computeCmdProgram = (ShaderProgram *)0x0;
  }
  if (this->m_computeDataProgram != (ShaderProgram *)0x0) {
    pSVar1 = this->m_computeDataProgram;
    if (pSVar1 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar1);
      operator_delete(pSVar1,0xd0);
    }
    this->m_computeDataProgram = (ShaderProgram *)0x0;
  }
  if (this->m_computeIndicesProgram != (ShaderProgram *)0x0) {
    pSVar1 = this->m_computeIndicesProgram;
    if (pSVar1 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar1);
      operator_delete(pSVar1,0xd0);
    }
    this->m_computeIndicesProgram = (ShaderProgram *)0x0;
  }
  return;
}

Assistant:

void ComputeShaderGeneratedSeparateCase::deinit (void)
{
	// deinit parent
	ComputeShaderGeneratedCase::deinit();

	if (m_computeCmdProgram)
	{
		delete m_computeCmdProgram;
		m_computeCmdProgram = DE_NULL;
	}
	if (m_computeDataProgram)
	{
		delete m_computeDataProgram;
		m_computeDataProgram = DE_NULL;
	}
	if (m_computeIndicesProgram)
	{
		delete m_computeIndicesProgram;
		m_computeIndicesProgram = DE_NULL;
	}
}